

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

xmlRelaxNGDefinePtr_conflict
xmlRelaxNGParseNameClass
          (xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node,xmlRelaxNGDefinePtr_conflict def)

{
  xmlRelaxNGDefinePtr pxVar1;
  bool bVar2;
  int iVar3;
  xmlRelaxNGDefinePtr_conflict pxVar4;
  xmlChar *pxVar5;
  xmlRelaxNGDefinePtr_conflict pxVar6;
  xmlRelaxNGDefinePtr_conflict pxVar7;
  xmlRelaxNGDefinePtr_conflict pxVar8;
  xmlRelaxNGDefinePtr pxVar9;
  char *msg;
  xmlChar *str1;
  xmlChar *str2;
  _xmlNode *node_00;
  
  pxVar4 = def;
  if ((((((node->ns != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) &&
        (iVar3 = xmlStrEqual(node->name,"name"), iVar3 != 0)) &&
       (iVar3 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
       iVar3 != 0)) ||
      ((((node->ns != (xmlNs *)0x0 && (node->type == XML_ELEMENT_NODE)) &&
        ((iVar3 = xmlStrEqual(node->name,(xmlChar *)"anyName"), iVar3 != 0 &&
         (iVar3 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
         iVar3 != 0)))) ||
       (((node->ns != (xmlNs *)0x0 && (node->type == XML_ELEMENT_NODE)) &&
        ((iVar3 = xmlStrEqual(node->name,(xmlChar *)"nsName"), iVar3 != 0 &&
         (iVar3 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
         iVar3 != 0)))))))) &&
     ((def->type != XML_RELAXNG_ELEMENT && (def->type != XML_RELAXNG_ATTRIBUTE)))) {
    pxVar4 = xmlRelaxNGNewDefine(ctxt,node);
    if (pxVar4 == (xmlRelaxNGDefinePtr_conflict)0x0) {
      return (xmlRelaxNGDefinePtr_conflict)0x0;
    }
    pxVar4->parent = def;
    pxVar4->type = (ctxt->flags & 1U) * 5 + XML_RELAXNG_ELEMENT;
  }
  if ((((node->ns != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) &&
      (iVar3 = xmlStrEqual(node->name,"name"), iVar3 != 0)) &&
     (iVar3 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
     iVar3 != 0)) {
    pxVar5 = xmlNodeGetContent(node);
    xmlRelaxNGNormExtSpace(pxVar5);
    iVar3 = xmlValidateNCName(pxVar5,0);
    if (iVar3 != 0) {
      if (node->parent == (_xmlNode *)0x0) {
        msg = "name \'%s\' is not an NCName\n";
        str2 = (xmlChar *)0x0;
        str1 = pxVar5;
      }
      else {
        msg = "Element %s name \'%s\' is not an NCName\n";
        str1 = node->parent->name;
        str2 = pxVar5;
      }
      xmlRngPErr(ctxt,node,0x3fb,msg,str1,str2);
    }
    pxVar4->name = pxVar5;
    pxVar5 = xmlGetProp(node,"ns");
    pxVar4->ns = pxVar5;
    if (((pxVar5 != (xmlChar *)0x0 & (byte)ctxt->flags) == 1) &&
       (iVar3 = xmlStrEqual(pxVar5,(xmlChar *)"http://www.w3.org/2000/xmlns"), iVar3 != 0)) {
      xmlRngPErr(ctxt,node,0x462,"Attribute with namespace \'%s\' is not allowed\n",pxVar5,
                 (xmlChar *)0x0);
    }
    if ((((pxVar5 != (xmlChar *)0x0 & (byte)ctxt->flags) == 1) && (*pxVar5 == '\0')) &&
       (iVar3 = xmlStrEqual(pxVar4->name,"xmlns"), iVar3 != 0)) {
      xmlRngPErr(ctxt,node,0x461,"Attribute with QName \'xmlns\' is not allowed\n",pxVar5,
                 (xmlChar *)0x0);
    }
    goto LAB_00187b3d;
  }
  if ((((node->ns == (xmlNs *)0x0) || (node->type != XML_ELEMENT_NODE)) ||
      (iVar3 = xmlStrEqual(node->name,(xmlChar *)"anyName"), iVar3 == 0)) ||
     (iVar3 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
     iVar3 == 0)) {
    if (((node->ns == (xmlNs *)0x0) || (node->type != XML_ELEMENT_NODE)) ||
       ((iVar3 = xmlStrEqual(node->name,(xmlChar *)"nsName"), iVar3 == 0 ||
        (iVar3 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
        iVar3 == 0)))) {
      if (((node->ns == (xmlNs *)0x0) || (node->type != XML_ELEMENT_NODE)) ||
         ((iVar3 = xmlStrEqual(node->name,(xmlChar *)"choice"), iVar3 == 0 ||
          (iVar3 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
          iVar3 == 0)))) {
        xmlRngPErr(ctxt,node,0x3ee,"expecting name, anyName, nsName or choice : got %s\n",node->name
                   ,(xmlChar *)0x0);
        return (xmlRelaxNGDefinePtr_conflict)0x0;
      }
      pxVar4 = def;
      if (def->type == XML_RELAXNG_CHOICE) {
LAB_001879e5:
        node_00 = node->children;
        if (node_00 == (_xmlNode *)0x0) {
          xmlRngPErr(ctxt,node,0x3ef,"Element choice is empty\n",(xmlChar *)0x0,(xmlChar *)0x0);
        }
        else {
          pxVar6 = (xmlRelaxNGDefinePtr_conflict)0x0;
          do {
            pxVar7 = xmlRelaxNGParseNameClass(ctxt,node_00,pxVar4);
            pxVar8 = pxVar6;
            if (((pxVar7 != (xmlRelaxNGDefinePtr_conflict)0x0) &&
                (pxVar8 = pxVar7, pxVar6 != (xmlRelaxNGDefinePtr_conflict)0x0)) &&
               (pxVar8 = pxVar6, pxVar7 != pxVar4)) {
              pxVar6->next = pxVar7;
              pxVar8 = pxVar7;
            }
            node_00 = node_00->next;
            pxVar6 = pxVar8;
          } while (node_00 != (_xmlNode *)0x0);
        }
        bVar2 = true;
      }
      else {
        pxVar4 = xmlRelaxNGNewDefine(ctxt,node);
        if (pxVar4 != (xmlRelaxNGDefinePtr_conflict)0x0) {
          pxVar4->parent = def;
          pxVar4->type = XML_RELAXNG_CHOICE;
          goto LAB_001879e5;
        }
        pxVar4 = (xmlRelaxNGDefinePtr_conflict)0x0;
        bVar2 = false;
      }
      if (!bVar2) {
        return (xmlRelaxNGDefinePtr_conflict)0x0;
      }
      goto LAB_00187b3d;
    }
    pxVar4->name = (xmlChar *)0x0;
    pxVar5 = xmlGetProp(node,"ns");
    pxVar4->ns = pxVar5;
    if (pxVar5 == (xmlChar *)0x0) {
      xmlRngPErr(ctxt,node,0x421,"nsName has no ns attribute\n",(xmlChar *)0x0,(xmlChar *)0x0);
    }
    if ((((ctxt->flags & 1) != 0) && (pxVar4->ns != (xmlChar *)0x0)) &&
       (iVar3 = xmlStrEqual(pxVar4->ns,(xmlChar *)"http://www.w3.org/2000/xmlns"), iVar3 != 0)) {
      xmlRngPErr(ctxt,node,0x462,"Attribute with namespace \'%s\' is not allowed\n",pxVar4->ns,
                 (xmlChar *)0x0);
    }
  }
  else {
    pxVar4->name = (xmlChar *)0x0;
    pxVar4->ns = (xmlChar *)0x0;
  }
  if (node->children != (xmlNodePtr)0x0) {
    pxVar6 = xmlRelaxNGParseExceptNameClass
                       (ctxt,node->children,(uint)(def->type == XML_RELAXNG_ATTRIBUTE));
    pxVar4->nameClass = pxVar6;
  }
LAB_00187b3d:
  if (pxVar4 != def) {
    pxVar1 = def->nameClass;
    if (def->nameClass == (xmlRelaxNGDefinePtr)0x0) {
      def->nameClass = pxVar4;
    }
    else {
      do {
        pxVar9 = pxVar1;
        pxVar1 = pxVar9->next;
      } while (pxVar1 != (xmlRelaxNGDefinePtr)0x0);
      pxVar9->next = pxVar4;
    }
  }
  return pxVar4;
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGParseNameClass(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node,
                         xmlRelaxNGDefinePtr def)
{
    xmlRelaxNGDefinePtr ret, tmp;
    xmlChar *val;

    ret = def;
    if ((IS_RELAXNG(node, "name")) || (IS_RELAXNG(node, "anyName")) ||
        (IS_RELAXNG(node, "nsName"))) {
        if ((def->type != XML_RELAXNG_ELEMENT) &&
            (def->type != XML_RELAXNG_ATTRIBUTE)) {
            ret = xmlRelaxNGNewDefine(ctxt, node);
            if (ret == NULL)
                return (NULL);
            ret->parent = def;
            if (ctxt->flags & XML_RELAXNG_IN_ATTRIBUTE)
                ret->type = XML_RELAXNG_ATTRIBUTE;
            else
                ret->type = XML_RELAXNG_ELEMENT;
        }
    }
    if (IS_RELAXNG(node, "name")) {
        val = xmlNodeGetContent(node);
        xmlRelaxNGNormExtSpace(val);
        if (xmlValidateNCName(val, 0)) {
	    if (node->parent != NULL)
		xmlRngPErr(ctxt, node, XML_RNGP_ELEMENT_NAME,
			   "Element %s name '%s' is not an NCName\n",
			   node->parent->name, val);
	    else
		xmlRngPErr(ctxt, node, XML_RNGP_ELEMENT_NAME,
			   "name '%s' is not an NCName\n",
			   val, NULL);
        }
        ret->name = val;
        val = xmlGetProp(node, BAD_CAST "ns");
        ret->ns = val;
        if ((ctxt->flags & XML_RELAXNG_IN_ATTRIBUTE) &&
            (val != NULL) &&
            (xmlStrEqual(val, BAD_CAST "http://www.w3.org/2000/xmlns"))) {
	    xmlRngPErr(ctxt, node, XML_RNGP_XML_NS,
                        "Attribute with namespace '%s' is not allowed\n",
                        val, NULL);
        }
        if ((ctxt->flags & XML_RELAXNG_IN_ATTRIBUTE) &&
            (val != NULL) &&
            (val[0] == 0) && (xmlStrEqual(ret->name, BAD_CAST "xmlns"))) {
	    xmlRngPErr(ctxt, node, XML_RNGP_XMLNS_NAME,
                       "Attribute with QName 'xmlns' is not allowed\n",
                       val, NULL);
        }
    } else if (IS_RELAXNG(node, "anyName")) {
        ret->name = NULL;
        ret->ns = NULL;
        if (node->children != NULL) {
            ret->nameClass =
                xmlRelaxNGParseExceptNameClass(ctxt, node->children,
                                               (def->type ==
                                                XML_RELAXNG_ATTRIBUTE));
        }
    } else if (IS_RELAXNG(node, "nsName")) {
        ret->name = NULL;
        ret->ns = xmlGetProp(node, BAD_CAST "ns");
        if (ret->ns == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_NSNAME_NO_NS,
                       "nsName has no ns attribute\n", NULL, NULL);
        }
        if ((ctxt->flags & XML_RELAXNG_IN_ATTRIBUTE) &&
            (ret->ns != NULL) &&
            (xmlStrEqual
             (ret->ns, BAD_CAST "http://www.w3.org/2000/xmlns"))) {
            xmlRngPErr(ctxt, node, XML_RNGP_XML_NS,
                       "Attribute with namespace '%s' is not allowed\n",
                       ret->ns, NULL);
        }
        if (node->children != NULL) {
            ret->nameClass =
                xmlRelaxNGParseExceptNameClass(ctxt, node->children,
                                               (def->type ==
                                                XML_RELAXNG_ATTRIBUTE));
        }
    } else if (IS_RELAXNG(node, "choice")) {
        xmlNodePtr child;
        xmlRelaxNGDefinePtr last = NULL;

        if (def->type == XML_RELAXNG_CHOICE) {
            ret = def;
        } else {
            ret = xmlRelaxNGNewDefine(ctxt, node);
            if (ret == NULL)
                return (NULL);
            ret->parent = def;
            ret->type = XML_RELAXNG_CHOICE;
        }

        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_CHOICE_EMPTY,
                       "Element choice is empty\n", NULL, NULL);
        } else {

            child = node->children;
            while (child != NULL) {
                tmp = xmlRelaxNGParseNameClass(ctxt, child, ret);
                if (tmp != NULL) {
                    if (last == NULL) {
                        last = tmp;
                    } else if (tmp != ret) {
                        last->next = tmp;
                        last = tmp;
                    }
                }
                child = child->next;
            }
        }
    } else {
        xmlRngPErr(ctxt, node, XML_RNGP_CHOICE_CONTENT,
                   "expecting name, anyName, nsName or choice : got %s\n",
                   (node == NULL ? (const xmlChar *) "nothing" : node->name),
		   NULL);
        return (NULL);
    }
    if (ret != def) {
        if (def->nameClass == NULL) {
            def->nameClass = ret;
        } else {
            tmp = def->nameClass;
            while (tmp->next != NULL) {
                tmp = tmp->next;
            }
            tmp->next = ret;
        }
    }
    return (ret);
}